

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O0

void __thiscall deqp::ShaderRenderCase::~ShaderRenderCase(ShaderRenderCase *this)

{
  ShaderRenderCase *this_local;
  
  ~ShaderRenderCase(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

ShaderRenderCase::~ShaderRenderCase(void)
{
	ShaderRenderCase::deinit();
}